

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

void __thiscall rw::Geometry::destroy(Geometry *this)

{
  int iVar1;
  
  iVar1 = this->refCount;
  this->refCount = iVar1 + -1;
  if (iVar1 < 2) {
    PluginList::destruct((PluginList *)&s_plglist,this);
    (*DAT_00149de0)(this->triangles);
    (*DAT_00149de0)(this->morphTargets);
    (*DAT_00149de0)(this->meshHeader);
    MaterialList::deinit(&this->matList);
    (*DAT_00149de0)(this);
    numAllocated = numAllocated + -1;
  }
  return;
}

Assistant:

void
Geometry::destroy(void)
{
	this->refCount--;
	if(this->refCount <= 0){
		s_plglist.destruct(this);
		// Also frees colors and tex coords
		rwFree(this->triangles);
		// Also frees their data
		rwFree(this->morphTargets);
		// Also frees indices
		rwFree(this->meshHeader);
		this->matList.deinit();
		rwFree(this);
		numAllocated--;
	}
}